

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply_randomizer_options.cpp
# Opt level: O0

void apply_randomizer_options(RandomizerOptions *options,RandomizerWorld *world)

{
  uint8_t life;
  uint16_t golds;
  RandomizerWorld *world_local;
  RandomizerOptions *options_local;
  
  golds = RandomizerOptions::starting_gold(options);
  World::starting_golds(&world->super_World,golds);
  life = RandomizerOptions::starting_life(options);
  World::starting_life(&world->super_World,life);
  patch_starting_flags(&world->super_World,options);
  patch_items(&world->super_World,options);
  patch_game_strings(&world->super_World,options);
  apply_options_on_logic_paths(options,world);
  apply_options_on_spawn_locations(options,world);
  apply_options_on_item_distributions(options,world);
  apply_options_on_hint_sources(options,world);
  return;
}

Assistant:

void apply_randomizer_options(const RandomizerOptions& options, RandomizerWorld& world)
{
    world.starting_golds(options.starting_gold());
    world.starting_life(options.starting_life());

    patch_starting_flags(world, options);
    patch_items(world, options);
    patch_game_strings(world, options);

    apply_options_on_logic_paths(options, world);
    apply_options_on_spawn_locations(options, world);
    apply_options_on_item_distributions(options, world);
    apply_options_on_hint_sources(options, world);
}